

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintserialize.h
# Opt level: O0

ssize_t bsplib::UIntSerialize<unsigned_long>::read(int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  uint uVar2;
  undefined4 in_register_0000003c;
  undefined8 local_28;
  unsigned_long power;
  uchar c;
  uchar m;
  int i;
  unsigned_long *x_local;
  uchar *cs_local;
  
  *(undefined8 *)__buf = 0;
  power._4_4_ = 0;
  local_28 = 1;
  do {
    uVar2 = power._4_4_ + 1;
    bVar1 = *(byte *)(CONCAT44(in_register_0000003c,__fd) + (long)(int)power._4_4_);
    *(long *)__buf = local_28 * (int)(bVar1 & 0x7f) + *__buf;
    local_28 = local_28 << 7;
    power._4_4_ = uVar2;
  } while ((bVar1 & 0x80) != 0);
  return (ulong)uVar2;
}

Assistant:

static int read( const unsigned char * cs, UInt & x ) {
        x = 0;
        int i = 0;
        unsigned char m = (1 << (CHAR_BIT-1));
        unsigned char c = 0;
        UInt power = 1;
        do {
            c = cs[i++];
            x += power * (c & (m-1));
            power <<= (CHAR_BIT-1);
        } while (c & m);

        return i;
    }